

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O3

UBool __thiscall
icu_63::RuleBasedNumberFormat::operator==(RuleBasedNumberFormat *this,Format *other)

{
  NFRuleSet **ppNVar1;
  char *__s1;
  char *__s2;
  UBool UVar2;
  int iVar3;
  uint uVar4;
  long *plVar5;
  NFRuleSet *this_00;
  NFRuleSet **ppNVar6;
  
  if (this == (RuleBasedNumberFormat *)other) {
    return '\x01';
  }
  __s1 = *(char **)((this->super_NumberFormat).super_Format.super_UObject._vptr_UObject[-1] + 8);
  __s2 = *(char **)((other->super_UObject)._vptr_UObject[-1] + 8);
  if ((((__s1 == __s2) || ((*__s1 != '*' && (iVar3 = strcmp(__s1,__s2), iVar3 == 0)))) &&
      (UVar2 = Locale::operator==(&this->locale,(Locale *)(other[1].actualLocale + 0x38)),
      UVar2 != '\0')) && (this->lenient == other[1].field_0x144)) {
    if (this->localizations == (LocalizationInfo *)0x0) {
      uVar4 = (uint)(*(long *)other[2].actualLocale == 0);
    }
    else {
      if (*(long *)other[2].actualLocale == 0) {
        return '\0';
      }
      iVar3 = (*this->localizations->_vptr_LocalizationInfo[2])();
      uVar4 = (uint)(char)iVar3;
    }
    if (uVar4 != 0) {
      ppNVar6 = this->fRuleSets;
      plVar5 = *(long **)(other[1].actualLocale + 0x18);
      if (plVar5 == (long *)0x0 || ppNVar6 == (NFRuleSet **)0x0) {
        return ppNVar6 == (NFRuleSet **)0x0 && plVar5 == (long *)0x0;
      }
      this_00 = *ppNVar6;
      while (this_00 != (NFRuleSet *)0x0) {
        if ((NFRuleSet *)*plVar5 == (NFRuleSet *)0x0) {
          return '\0';
        }
        UVar2 = NFRuleSet::operator==(this_00,(NFRuleSet *)*plVar5);
        if (UVar2 == '\0') break;
        plVar5 = plVar5 + 1;
        ppNVar1 = ppNVar6 + 1;
        ppNVar6 = ppNVar6 + 1;
        this_00 = *ppNVar1;
      }
      if (*plVar5 == 0) {
        return *ppNVar6 == (NFRuleSet *)0x0;
      }
    }
  }
  return '\0';
}

Assistant:

UBool
RuleBasedNumberFormat::operator==(const Format& other) const
{
    if (this == &other) {
        return TRUE;
    }

    if (typeid(*this) == typeid(other)) {
        const RuleBasedNumberFormat& rhs = (const RuleBasedNumberFormat&)other;
        // test for capitalization info equality is adequately handled
        // by the NumberFormat test for fCapitalizationContext equality;
        // the info here is just derived from that.
        if (locale == rhs.locale &&
            lenient == rhs.lenient &&
            (localizations == NULL 
                ? rhs.localizations == NULL 
                : (rhs.localizations == NULL 
                    ? FALSE
                    : *localizations == rhs.localizations))) {

            NFRuleSet** p = fRuleSets;
            NFRuleSet** q = rhs.fRuleSets;
            if (p == NULL) {
                return q == NULL;
            } else if (q == NULL) {
                return FALSE;
            }
            while (*p && *q && (**p == **q)) {
                ++p;
                ++q;
            }
            return *q == NULL && *p == NULL;
        }
    }

    return FALSE;
}